

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_list.h
# Opt level: O0

node * __thiscall cds::intrusive::FreeList::get(FreeList *this)

{
  bool bVar1;
  __int_type_conflict1 _Var2;
  __pointer_type pnVar3;
  node *next;
  node *pnStack_b0;
  __int_type_conflict1 refs;
  __pointer_type prevHead;
  __pointer_type head;
  FreeList *this_local;
  uint local_8c;
  memory_order local_88;
  int local_84;
  memory_order __b_1;
  uint local_74;
  memory_order local_70;
  int local_6c;
  memory_order __b;
  undefined1 local_59;
  __int_type_conflict1 local_58;
  undefined4 local_54;
  undefined4 local_50;
  __int_type_conflict1 local_4c;
  long local_48;
  __pointer_type local_40;
  __int_type_conflict1 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  node *local_28;
  
  head = (__pointer_type)this;
  prevHead = std::atomic<cds::intrusive::FreeList::node_*>::load(&this->m_Head,memory_order_acquire)
  ;
  while( true ) {
    while( true ) {
      pnVar3 = prevHead;
      if (prevHead == (__pointer_type)0x0) {
        return (node *)0x0;
      }
      pnStack_b0 = prevHead;
      ___b = prevHead;
      local_6c = 0;
      local_70 = std::operator&(memory_order_relaxed,__memory_order_mask);
      if (local_6c - 1U < 2) {
        local_74 = (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
      }
      else if (local_6c == 5) {
        local_74 = (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
      }
      else {
        local_74 = (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
      }
      next._4_4_ = local_74;
      bVar1 = true;
      if ((local_74 & 0x7fffffff) != 0) {
        local_58 = local_74 + 1;
        local_40 = prevHead;
        local_48 = (long)&next + 4;
        local_50 = 2;
        local_54 = 0;
        LOCK();
        _Var2 = (prevHead->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
        local_59 = local_74 == _Var2;
        if ((bool)local_59) {
          (prevHead->m_freeListRefs).super___atomic_base<unsigned_int>._M_i = local_58;
          _Var2 = local_74;
        }
        UNLOCK();
        if (!(bool)local_59) {
          next._4_4_ = _Var2;
        }
        bVar1 = !(bool)local_59;
        local_4c = local_58;
      }
      if (!bVar1) break;
      prevHead = std::atomic<cds::intrusive::FreeList::node_*>::load
                           (&this->m_Head,memory_order_acquire);
    }
    pnVar3 = std::atomic<cds::intrusive::FreeList::node_*>::load
                       (&prevHead->m_freeListNext,memory_order_relaxed);
    bVar1 = std::atomic<cds::intrusive::FreeList::node_*>::compare_exchange_strong
                      (&this->m_Head,&prevHead,pnVar3,memory_order_acquire,memory_order_relaxed);
    pnVar3 = prevHead;
    if (bVar1) break;
    local_28 = pnStack_b0;
    local_2c = 1;
    local_30 = 4;
    local_34 = 1;
    LOCK();
    next._4_4_ = (pnStack_b0->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
    (pnStack_b0->m_freeListRefs).super___atomic_base<unsigned_int>._M_i =
         (pnStack_b0->m_freeListRefs).super___atomic_base<unsigned_int>._M_i - 1;
    UNLOCK();
    local_38 = next._4_4_;
    if (next._4_4_ == 0x80000001) {
      add_knowing_refcount_is_zero(this,pnStack_b0);
    }
  }
  ___b_1 = prevHead;
  local_84 = 0;
  local_88 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_84 - 1U < 2) {
    local_8c = (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
  }
  else if (local_84 == 5) {
    local_8c = (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
  }
  else {
    local_8c = (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
  }
  if ((local_8c & 0x80000000) == 0) {
    LOCK();
    (prevHead->m_freeListRefs).super___atomic_base<unsigned_int>._M_i =
         (prevHead->m_freeListRefs).super___atomic_base<unsigned_int>._M_i - 2;
    UNLOCK();
    return prevHead;
  }
  __assert_fail("(head->m_freeListRefs.load( atomics::memory_order_relaxed ) & c_ShouldBeOnFreeList) == 0"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/STEllAR-GROUP[P]libcds/cds/intrusive/free_list.h"
                ,0x84,"node *cds::intrusive::FreeList::get()");
}

Assistant:

node * get()
        {
            auto head = m_Head.load( atomics::memory_order_acquire );
            while ( head != nullptr ) {
                auto prevHead = head;
                auto refs = head->m_freeListRefs.load( atomics::memory_order_relaxed );

                if ( cds_unlikely( (refs & c_RefsMask) == 0 || !head->m_freeListRefs.compare_exchange_strong( refs, refs + 1,
                    atomics::memory_order_acquire, atomics::memory_order_relaxed )))
                {
                    head = m_Head.load( atomics::memory_order_acquire );
                    continue;
                }

                // Good, reference count has been incremented (it wasn't at zero), which means
                // we can read the next and not worry about it changing between now and the time
                // we do the CAS
                node * next = head->m_freeListNext.load( atomics::memory_order_relaxed );
                if ( cds_likely( m_Head.compare_exchange_strong( head, next, atomics::memory_order_acquire, atomics::memory_order_relaxed ))) {
                    // Yay, got the node. This means it was on the list, which means
                    // shouldBeOnFreeList must be false no matter the refcount (because
                    // nobody else knows it's been taken off yet, it can't have been put back on).
                    assert( (head->m_freeListRefs.load( atomics::memory_order_relaxed ) & c_ShouldBeOnFreeList) == 0 );

                    // Decrease refcount twice, once for our ref, and once for the list's ref
                    head->m_freeListRefs.fetch_sub( 2, atomics::memory_order_relaxed );

                    return head;
                }

                // OK, the head must have changed on us, but we still need to decrease the refcount we
                // increased
                refs = prevHead->m_freeListRefs.fetch_sub( 1, atomics::memory_order_acq_rel );
                if ( refs == c_ShouldBeOnFreeList + 1 )
                    add_knowing_refcount_is_zero( prevHead );
            }

            return nullptr;
        }